

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O3

string * __thiscall
wabt::Decompiler::OpcodeToToken_abi_cxx11_
          (string *__return_storage_ptr__,Decompiler *this,Opcode opcode)

{
  size_type sVar1;
  pointer pcVar2;
  char *pcVar3;
  size_type sVar4;
  allocator local_d;
  Opcode local_c;
  
  local_c.enum_ = opcode.enum_;
  pcVar3 = Opcode::GetDecomp(&local_c);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,&local_d);
  sVar1 = __return_storage_ptr__->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      if (pcVar2[sVar4] == '.') {
        pcVar2[sVar4] = '_';
      }
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpcodeToToken(Opcode opcode) {
    std::string s = opcode.GetDecomp();
    std::replace(s.begin(), s.end(), '.', '_');
    return s;
  }